

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O0

void __thiscall node::BlockManager::CleanupBlockRevFiles(BlockManager *this)

{
  long lVar1;
  string_view str;
  bool bVar2;
  size_type sVar3;
  path *ppVar4;
  reference ppVar5;
  directory_iterator *in_RDI;
  long in_FS_OFFSET;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>
  *item;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
  *__range1;
  int nContigCounter;
  iterator __end1;
  iterator __begin1;
  directory_iterator it;
  string path;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
  mapBlockFiles;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffdac;
  char *path_00;
  path *in_stack_fffffffffffffdb8;
  path *in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdc8;
  uint in_stack_fffffffffffffdcc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  uint in_stack_fffffffffffffddc;
  uint uVar7;
  undefined2 uVar8;
  int local_1f4;
  undefined4 in_stack_fffffffffffffe10;
  uint uVar9;
  undefined4 in_stack_fffffffffffffe14;
  int in_stack_fffffffffffffe1c;
  char *pcVar10;
  directory_iterator *pdVar11;
  undefined1 local_1c0 [24];
  ConstevalFormatString<0U> in_stack_fffffffffffffe58;
  string_view in_stack_fffffffffffffe60;
  string_view in_stack_fffffffffffffe70;
  Level in_stack_ffffffffffffff50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pdVar11 = in_RDI;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
         *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
             (char *)in_stack_fffffffffffffdc0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
             (char *)in_stack_fffffffffffffdc0);
  pcVar10 = "Removing unusable blk?????.dat and rev?????.dat files for -reindex with -prune\n";
  path_00 = "Removing unusable blk?????.dat and rev?????.dat files for -reindex with -prune\n";
  uVar6 = 2;
  LogPrintFormatInternal<>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe60,in_stack_fffffffffffffe1c,
             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),in_stack_ffffffffffffff50
             ,in_stack_fffffffffffffe58);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)CONCAT44(in_stack_fffffffffffffdac,uVar6),(path *)0x10fac31);
  while( true ) {
    memset(local_1c0,0,0x10);
    std::filesystem::__cxx11::directory_iterator::directory_iterator
              ((directory_iterator *)CONCAT44(in_stack_fffffffffffffdac,uVar6));
    bVar2 = std::filesystem::__cxx11::operator!=
                      ((directory_iterator *)in_stack_fffffffffffffdb8,(directory_iterator *)path_00
                      );
    uVar7 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffddc);
    std::filesystem::__cxx11::directory_iterator::~directory_iterator
              ((directory_iterator *)CONCAT44(in_stack_fffffffffffffdac,uVar6));
    if ((uVar7 & 0x1000000) == 0) break;
    std::filesystem::__cxx11::directory_iterator::operator->
              ((directory_iterator *)CONCAT44(in_stack_fffffffffffffdac,uVar6));
    std::filesystem::__cxx11::directory_entry::path
              ((directory_entry *)CONCAT44(in_stack_fffffffffffffdac,uVar6));
    std::filesystem::__cxx11::path::filename(in_stack_fffffffffffffdc0);
    fs::path::path((path *)CONCAT44(in_stack_fffffffffffffdac,uVar6),(path *)0x10face9);
    fs::PathToString_abi_cxx11_((path *)path_00);
    fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffdac,uVar6));
    std::filesystem::__cxx11::path::~path((path *)CONCAT44(in_stack_fffffffffffffdac,uVar6));
    std::filesystem::__cxx11::directory_iterator::operator*
              ((directory_iterator *)(local_1c0 + 0x10));
    std::filesystem::__cxx11::directory_entry::operator_cast_to_path_
              ((directory_entry *)CONCAT44(in_stack_fffffffffffffdac,uVar6));
    uVar9 = 0;
    bVar2 = std::filesystem::is_regular_file(in_stack_fffffffffffffdb8);
    in_stack_fffffffffffffddc =
         CONCAT22((short)(CONCAT13((char)(uVar7 >> 0x18),CONCAT12(bVar2,(short)uVar7)) >> 0x10),
                  (short)uVar7) & 0xffff00ff;
    if (bVar2) {
      sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              length((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffdac,uVar6));
      in_stack_fffffffffffffddc =
           CONCAT22((short)(in_stack_fffffffffffffddc >> 0x10),
                    (ushort)(byte)in_stack_fffffffffffffddc);
      if (sVar3 == 0xc) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (in_stack_fffffffffffffdd0,
                   CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                   (size_type)in_stack_fffffffffffffdc0);
        uVar8 = (undefined2)(in_stack_fffffffffffffddc >> 0x10);
        uVar9 = 0x1000000;
        bVar2 = std::operator==(&in_stack_fffffffffffffdb8->_M_pathname,path_00);
        in_stack_fffffffffffffddc = CONCAT22(uVar8,CONCAT11(bVar2,bVar2));
      }
    }
    uVar7 = in_stack_fffffffffffffddc >> 8;
    if ((uVar9 & 0x1000000) != 0) {
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffdac,uVar6));
    }
    if ((char)uVar7 != '\0') {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (in_stack_fffffffffffffdd0,
                 CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                 (size_type)in_stack_fffffffffffffdc0);
      bVar2 = std::operator==(&in_stack_fffffffffffffdb8->_M_pathname,path_00);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffdac,uVar6));
      if (bVar2) {
        std::filesystem::__cxx11::directory_iterator::operator->
                  ((directory_iterator *)CONCAT44(in_stack_fffffffffffffdac,uVar6));
        std::filesystem::__cxx11::directory_entry::path
                  ((directory_entry *)CONCAT44(in_stack_fffffffffffffdac,uVar6));
        std::filesystem::__cxx11::path::path
                  ((path *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                   in_stack_fffffffffffffdc0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (in_stack_fffffffffffffdd0,
                   CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                   (size_type)in_stack_fffffffffffffdc0);
        in_stack_fffffffffffffdd0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
                           *)in_stack_fffffffffffffdd0,
                          (key_type *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8))
        ;
        fs::path::operator=((path *)in_stack_fffffffffffffdb8,(path *)path_00);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffdac,uVar6));
        std::filesystem::__cxx11::path::~path((path *)CONCAT44(in_stack_fffffffffffffdac,uVar6));
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (in_stack_fffffffffffffdd0,
                   CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                   (size_type)in_stack_fffffffffffffdc0);
        bVar2 = std::operator==(&in_stack_fffffffffffffdb8->_M_pathname,path_00);
        in_stack_fffffffffffffdcc = CONCAT13(bVar2,(int3)in_stack_fffffffffffffdcc);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffdac,uVar6));
        if ((in_stack_fffffffffffffdcc & 0x1000000) != 0) {
          std::filesystem::__cxx11::directory_iterator::operator->
                    ((directory_iterator *)CONCAT44(in_stack_fffffffffffffdac,uVar6));
          ppVar4 = std::filesystem::__cxx11::directory_entry::path
                             ((directory_entry *)CONCAT44(in_stack_fffffffffffffdac,uVar6));
          std::filesystem::remove(ppVar4);
        }
      }
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffdac,uVar6));
    std::filesystem::__cxx11::directory_iterator::operator++(in_RDI,in_stack_fffffffffffffddc);
    std::filesystem::__cxx11::__directory_iterator_proxy::~__directory_iterator_proxy
              ((__directory_iterator_proxy *)CONCAT44(in_stack_fffffffffffffdac,uVar6));
  }
  std::filesystem::__cxx11::directory_iterator::~directory_iterator
            ((directory_iterator *)CONCAT44(in_stack_fffffffffffffdac,uVar6));
  local_1f4 = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
  ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
           *)path_00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
  ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
         *)path_00);
  while (bVar2 = std::operator==((_Self *)in_stack_fffffffffffffdb8,(_Self *)path_00),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>
             ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>
                          *)CONCAT44(in_stack_fffffffffffffdac,uVar6));
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
    str._M_str = (char *)pdVar11;
    str._M_len = (size_t)pcVar10;
    in_stack_fffffffffffffdc8 = LocaleIndependentAtoi<int>(str);
    if (in_stack_fffffffffffffdc8 == local_1f4) {
      local_1f4 = local_1f4 + 1;
    }
    else {
      std::filesystem::remove(&(ppVar5->second).super_path);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>
                  *)CONCAT44(in_stack_fffffffffffffdac,uVar6));
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
          *)CONCAT44(in_stack_fffffffffffffdac,uVar6));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BlockManager::CleanupBlockRevFiles() const
{
    std::map<std::string, fs::path> mapBlockFiles;

    // Glob all blk?????.dat and rev?????.dat files from the blocks directory.
    // Remove the rev files immediately and insert the blk file paths into an
    // ordered map keyed by block file index.
    LogPrintf("Removing unusable blk?????.dat and rev?????.dat files for -reindex with -prune\n");
    for (fs::directory_iterator it(m_opts.blocks_dir); it != fs::directory_iterator(); it++) {
        const std::string path = fs::PathToString(it->path().filename());
        if (fs::is_regular_file(*it) &&
            path.length() == 12 &&
            path.substr(8,4) == ".dat")
        {
            if (path.substr(0, 3) == "blk") {
                mapBlockFiles[path.substr(3, 5)] = it->path();
            } else if (path.substr(0, 3) == "rev") {
                remove(it->path());
            }
        }
    }

    // Remove all block files that aren't part of a contiguous set starting at
    // zero by walking the ordered map (keys are block file indices) by
    // keeping a separate counter.  Once we hit a gap (or if 0 doesn't exist)
    // start removing block files.
    int nContigCounter = 0;
    for (const std::pair<const std::string, fs::path>& item : mapBlockFiles) {
        if (LocaleIndependentAtoi<int>(item.first) == nContigCounter) {
            nContigCounter++;
            continue;
        }
        remove(item.second);
    }
}